

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TtStoreWrite(char *pFileName,Abc_TtStore_t *p,int fBinary)

{
  int iVar1;
  FILE *__s;
  long lVar2;
  char pBuffer [1000];
  char acStack_418 [1000];
  
  iVar1 = 8 << ((char)p->nVars - 6U & 0x1f);
  if (p->nVars < 7) {
    iVar1 = 8;
  }
  __s = fopen(pFileName,"wb");
  if (__s != (FILE *)0x0) {
    if (0 < p->nFuncs) {
      lVar2 = 0;
      do {
        if (fBinary == 0) {
          Abc_TruthWriteHex((FILE *)__s,p->pFuncs[lVar2],p->nVars);
          fwrite("    ",4,1,__s);
          Dau_DsdDecompose(p->pFuncs[lVar2],p->nVars,0,(uint)(p->nVars < 0xb),acStack_418);
          fprintf(__s,"%s\n",acStack_418);
        }
        else {
          fwrite(p->pFuncs[lVar2],(long)iVar1,1,__s);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->nFuncs);
    }
    fclose(__s);
    return;
  }
  printf("Cannot open file \"%s\" for writing.\n",pFileName);
  return;
}

Assistant:

void Abc_TtStoreWrite( char * pFileName, Abc_TtStore_t * p, int fBinary )
{
    FILE * pFile;
    char pBuffer[1000];
    int i, nBytes = 8 * Abc_Truth6WordNum( p->nVars );
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( fBinary )
            fwrite( p->pFuncs[i], nBytes, 1, pFile );
        else
        {
            Abc_TruthWriteHex( pFile, p->pFuncs[i], p->nVars ), fprintf( pFile, "    " );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, (int)(p->nVars <= 10), pBuffer );
            fprintf( pFile, "%s\n", pBuffer );
        }
    }
    fclose( pFile );
}